

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void __thiscall tinygltf::TinyGLTF::~TinyGLTF(TinyGLTF *this)

{
  TinyGLTF *this_local;
  
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_const_tinygltf::Image_*,_bool,_const_tinygltf::FsCallbacks_*,_const_tinygltf::URICallbacks_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_void_*)>
  ::~function(&this->WriteImageData);
  std::
  function<bool_(tinygltf::Image_*,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int,_int,_const_unsigned_char_*,_int,_void_*)>
  ::~function(&this->LoadImageData);
  URICallbacks::~URICallbacks(&this->uri_cb);
  FsCallbacks::~FsCallbacks(&this->fs);
  std::__cxx11::string::~string((string *)&this->err_);
  std::__cxx11::string::~string((string *)&this->warn_);
  return;
}

Assistant:

~TinyGLTF() = default;